

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_ApproximateModifiedEquivalencyTest_Test::
TestBody(MessageDifferencerTest_ApproximateModifiedEquivalencyTest_Test *this)

{
  bool bVar1;
  Message *pMVar2;
  char *pcVar3;
  char *in_R9;
  string local_8a0;
  AssertHelper local_880;
  Message local_878;
  bool local_869;
  undefined1 local_868 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_838;
  Message local_830;
  bool local_821;
  undefined1 local_820 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_7f0;
  Message local_7e8;
  bool local_7d9;
  undefined1 local_7d8 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_7a8;
  Message local_7a0;
  bool local_791;
  undefined1 local_790 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_760;
  Message local_758;
  bool local_749;
  undefined1 local_748 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_718;
  Message local_710;
  bool local_701;
  undefined1 local_700 [8];
  AssertionResult gtest_ar_;
  Message local_6e8;
  undefined1 local_6e0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_6c8;
  Message local_6c0;
  undefined1 local_6b8 [8];
  AssertionResult gtest_ar;
  float local_6a0;
  float v2;
  float v1;
  undefined1 local_690 [8];
  TestAllTypes msg2;
  TestAllTypes msg1;
  MessageDifferencerTest_ApproximateModifiedEquivalencyTest_Test *this_local;
  
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)((long)&msg2.field_0 + 0x328));
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)local_690);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>
            ((TestAllTypes *)((long)&msg2.field_0 + 0x328));
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>((TestAllTypes *)local_690);
  local_6a0 = 2.300005;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0x4013334c;
  proto2_unittest::TestAllTypes::set_optional_float
            ((TestAllTypes *)((long)&msg2.field_0 + 0x328),2.300005);
  proto2_unittest::TestAllTypes::set_optional_float((TestAllTypes *)local_690,2.300006);
  testing::internal::CmpHelperNE<float,float>
            ((internal *)local_6b8,"v1","v2",&local_6a0,
             (float *)((long)&gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      + 4));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b8);
  if (!bVar1) {
    testing::Message::Message(&local_6c0);
    pMVar2 = testing::Message::operator<<(&local_6c0,(char (*) [25])"Should not be the same: ");
    pMVar2 = testing::Message::operator<<(pMVar2,&local_6a0);
    pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [3])0x1fe663c);
    pMVar2 = testing::Message::operator<<
                       (pMVar2,(float *)((long)&gtest_ar.message_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        + 4));
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_6b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_6c8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x3a2,pcVar3);
    testing::internal::AssertHelper::operator=(&local_6c8,pMVar2);
    testing::internal::AssertHelper::~AssertHelper(&local_6c8);
    testing::Message::~Message(&local_6c0);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b8);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    testing::internal::CmpHelperFloatingPointEQ<float>
              ((internal *)local_6e0,"v1","v2",2.300005,2.300006);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6e0);
    if (!bVar1) {
      testing::Message::Message(&local_6e8);
      pMVar2 = testing::Message::operator<<(&local_6e8,(char (*) [26])"Should be approx. equal: ");
      pMVar2 = testing::Message::operator<<(pMVar2,&local_6a0);
      pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [3])0x1fe663c);
      pMVar2 = testing::Message::operator<<
                         (pMVar2,(float *)((long)&gtest_ar.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          + 4));
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_6e0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
                 ,0x3a3,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,pMVar2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
      testing::Message::~Message(&local_6e8);
    }
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_6e0);
    if (gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      bVar1 = util::MessageDifferencer::Equals
                        ((Message *)((long)&msg2.field_0 + 0x328),(Message *)local_690);
      local_701 = (bool)(~bVar1 & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_700,&local_701,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_700);
      if (!bVar1) {
        testing::Message::Message(&local_710);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__1.message_,(internal *)local_700,
                   (AssertionResult *)"util::MessageDifferencer::Equals(msg1, msg2)","true","false",
                   in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_718,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
                   ,0x3a4,pcVar3);
        testing::internal::AssertHelper::operator=(&local_718,&local_710);
        testing::internal::AssertHelper::~AssertHelper(&local_718);
        std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
        testing::Message::~Message(&local_710);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_700);
      local_749 = util::MessageDifferencer::ApproximatelyEquivalent
                            ((Message *)((long)&msg2.field_0 + 0x328),(Message *)local_690);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_748,&local_749,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_748);
      if (!bVar1) {
        testing::Message::Message(&local_758);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__2.message_,(internal *)local_748,
                   (AssertionResult *)
                   "util::MessageDifferencer::ApproximatelyEquivalent(msg1, msg2)","false","true",
                   in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_760,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
                   ,0x3a5,pcVar3);
        testing::internal::AssertHelper::operator=(&local_760,&local_758);
        testing::internal::AssertHelper::~AssertHelper(&local_760);
        std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
        testing::Message::~Message(&local_758);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_748);
      proto2_unittest::TestAllTypes::clear_optional_int32
                ((TestAllTypes *)((long)&msg2.field_0 + 0x328));
      proto2_unittest::TestAllTypes::set_optional_int32((TestAllTypes *)local_690,0);
      bVar1 = util::MessageDifferencer::Equals
                        ((Message *)((long)&msg2.field_0 + 0x328),(Message *)local_690);
      local_791 = (bool)(~bVar1 & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_790,&local_791,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_790);
      if (!bVar1) {
        testing::Message::Message(&local_7a0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_790,
                   (AssertionResult *)"util::MessageDifferencer::Equals(msg1, msg2)","true","false",
                   in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_7a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
                   ,0x3ac,pcVar3);
        testing::internal::AssertHelper::operator=(&local_7a8,&local_7a0);
        testing::internal::AssertHelper::~AssertHelper(&local_7a8);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_7a0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_790);
      bVar1 = util::MessageDifferencer::Equivalent
                        ((Message *)((long)&msg2.field_0 + 0x328),(Message *)local_690);
      local_7d9 = (bool)(~bVar1 & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_7d8,&local_7d9,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7d8);
      if (!bVar1) {
        testing::Message::Message(&local_7e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__4.message_,(internal *)local_7d8,
                   (AssertionResult *)"util::MessageDifferencer::Equivalent(msg1, msg2)","true",
                   "false",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_7f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
                   ,0x3ad,pcVar3);
        testing::internal::AssertHelper::operator=(&local_7f0,&local_7e8);
        testing::internal::AssertHelper::~AssertHelper(&local_7f0);
        std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
        testing::Message::~Message(&local_7e8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_7d8);
      bVar1 = util::MessageDifferencer::ApproximatelyEquals
                        ((Message *)((long)&msg2.field_0 + 0x328),(Message *)local_690);
      local_821 = (bool)(~bVar1 & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_820,&local_821,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_820);
      if (!bVar1) {
        testing::Message::Message(&local_830);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__5.message_,(internal *)local_820,
                   (AssertionResult *)"util::MessageDifferencer::ApproximatelyEquals(msg1, msg2)",
                   "true","false",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_838,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
                   ,0x3ae,pcVar3);
        testing::internal::AssertHelper::operator=(&local_838,&local_830);
        testing::internal::AssertHelper::~AssertHelper(&local_838);
        std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
        testing::Message::~Message(&local_830);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_820);
      local_869 = util::MessageDifferencer::ApproximatelyEquivalent
                            ((Message *)((long)&msg2.field_0 + 0x328),(Message *)local_690);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_868,&local_869,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_868);
      if (!bVar1) {
        testing::Message::Message(&local_878);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_8a0,(internal *)local_868,
                   (AssertionResult *)
                   "util::MessageDifferencer::ApproximatelyEquivalent(msg1, msg2)","false","true",
                   in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_880,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
                   ,0x3af,pcVar3);
        testing::internal::AssertHelper::operator=(&local_880,&local_878);
        testing::internal::AssertHelper::~AssertHelper(&local_880);
        std::__cxx11::string::~string((string *)&local_8a0);
        testing::Message::~Message(&local_878);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_868);
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = 0;
    }
  }
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)local_690);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)((long)&msg2.field_0 + 0x328));
  return;
}

Assistant:

TEST(MessageDifferencerTest, ApproximateModifiedEquivalencyTest) {
  // Create the testing protos
  unittest::TestAllTypes msg1;
  unittest::TestAllTypes msg2;

  TestUtil::SetAllFields(&msg1);
  TestUtil::SetAllFields(&msg2);

  // Modify the approximateness requirement
  const float v1 = 2.300005f;
  const float v2 = 2.300006f;
  msg1.set_optional_float(v1);
  msg2.set_optional_float(v2);

  // Compare
  ASSERT_NE(v1, v2) << "Should not be the same: " << v1 << ", " << v2;
  ASSERT_FLOAT_EQ(v1, v2) << "Should be approx. equal: " << v1 << ", " << v2;
  EXPECT_FALSE(util::MessageDifferencer::Equals(msg1, msg2));
  EXPECT_TRUE(util::MessageDifferencer::ApproximatelyEquivalent(msg1, msg2));

  // Modify the equivalency requirement too
  msg1.clear_optional_int32();
  msg2.set_optional_int32(0);

  // Compare. Now should only pass on ApproximatelyEquivalent
  EXPECT_FALSE(util::MessageDifferencer::Equals(msg1, msg2));
  EXPECT_FALSE(util::MessageDifferencer::Equivalent(msg1, msg2));
  EXPECT_FALSE(util::MessageDifferencer::ApproximatelyEquals(msg1, msg2));
  EXPECT_TRUE(util::MessageDifferencer::ApproximatelyEquivalent(msg1, msg2));
}